

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMLCPSolver.cpp
# Opt level: O2

btScalar __thiscall
btMLCPSolver::solveGroupCacheFriendlyIterations
          (btMLCPSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  int iVar1;
  btSolverConstraint *pbVar2;
  btSolverBody *pbVar3;
  int iVar4;
  long lVar5;
  btSolverBody *this_00;
  float fVar6;
  float impulseMagnitude;
  CProfileSample __profile_1;
  CProfileSample __profile;
  
  CProfileManager::Start_Profile("solveMLCP");
  iVar4 = (*(this->super_btSequentialImpulseConstraintSolver).super_btConstraintSolver.
            _vptr_btConstraintSolver[0xf])(this,infoGlobal);
  CProfileSample::~CProfileSample(&__profile);
  if ((char)iVar4 == '\0') {
    this->m_fallback = this->m_fallback + 1;
    btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations
              (&this->super_btSequentialImpulseConstraintSolver,bodies,numBodies,manifoldPtr,
               numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
  }
  else {
    CProfileManager::Start_Profile("process MLCP results");
    for (lVar5 = 0; lVar5 < (this->m_allConstraintPtrArray).m_size; lVar5 = lVar5 + 1) {
      pbVar2 = (this->m_allConstraintPtrArray).m_data[lVar5];
      iVar4 = pbVar2->m_solverBodyIdA;
      iVar1 = pbVar2->m_solverBodyIdB;
      fVar6 = (this->m_x).m_storage.m_data[lVar5];
      impulseMagnitude = fVar6 - pbVar2->m_appliedImpulse;
      pbVar3 = (this->super_btSequentialImpulseConstraintSolver).m_tmpSolverBodyPool.m_data;
      pbVar2->m_appliedImpulse = fVar6;
      ___profile = operator*(&pbVar2->m_contactNormal1,&pbVar3[iVar4].m_invMass);
      btSolverBody::internalApplyImpulse
                (pbVar3 + iVar4,(btVector3 *)&__profile,&pbVar2->m_angularComponentA,
                 impulseMagnitude);
      this_00 = pbVar3 + iVar1;
      ___profile = operator*(&pbVar2->m_contactNormal2,&this_00->m_invMass);
      btSolverBody::internalApplyImpulse
                (this_00,(btVector3 *)&__profile,&pbVar2->m_angularComponentB,impulseMagnitude);
      if ((infoGlobal->super_btContactSolverInfoData).m_splitImpulse != 0) {
        fVar6 = (this->m_xSplit).m_storage.m_data[lVar5] - pbVar2->m_appliedPushImpulse;
        ___profile = operator*(&pbVar2->m_contactNormal1,&pbVar3[iVar4].m_invMass);
        btSolverBody::internalApplyPushImpulse
                  (pbVar3 + iVar4,(btVector3 *)&__profile,&pbVar2->m_angularComponentA,fVar6);
        ___profile = operator*(&pbVar2->m_contactNormal2,&this_00->m_invMass);
        btSolverBody::internalApplyPushImpulse
                  (this_00,(btVector3 *)&__profile,&pbVar2->m_angularComponentB,fVar6);
        pbVar2->m_appliedPushImpulse = (this->m_xSplit).m_storage.m_data[lVar5];
      }
    }
    CProfileSample::~CProfileSample(&__profile_1);
  }
  return 0.0;
}

Assistant:

btScalar btMLCPSolver::solveGroupCacheFriendlyIterations(btCollisionObject** bodies ,int numBodies,btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	bool result = true;
	{
		BT_PROFILE("solveMLCP");
//		printf("m_A(%d,%d)\n", m_A.rows(),m_A.cols());
		result = solveMLCP(infoGlobal);
	}

	//check if solution is valid, and otherwise fallback to btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations
	if (result)
	{
		BT_PROFILE("process MLCP results");
		for (int i=0;i<m_allConstraintPtrArray.size();i++)
		{
			{
				btSolverConstraint& c = *m_allConstraintPtrArray[i];
				int sbA = c.m_solverBodyIdA;
				int sbB = c.m_solverBodyIdB;
				//btRigidBody* orgBodyA = m_tmpSolverBodyPool[sbA].m_originalBody;
			//	btRigidBody* orgBodyB = m_tmpSolverBodyPool[sbB].m_originalBody;

				btSolverBody& solverBodyA = m_tmpSolverBodyPool[sbA];
				btSolverBody& solverBodyB = m_tmpSolverBodyPool[sbB];
 
				{
					btScalar deltaImpulse = m_x[i]-c.m_appliedImpulse;
					c.m_appliedImpulse = m_x[i];
					solverBodyA.internalApplyImpulse(c.m_contactNormal1*solverBodyA.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
					solverBodyB.internalApplyImpulse(c.m_contactNormal2*solverBodyB.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
				}

				if (infoGlobal.m_splitImpulse)
				{
					btScalar deltaImpulse = m_xSplit[i] - c.m_appliedPushImpulse;
					solverBodyA.internalApplyPushImpulse(c.m_contactNormal1*solverBodyA.internalGetInvMass(),c.m_angularComponentA,deltaImpulse);
					solverBodyB.internalApplyPushImpulse(c.m_contactNormal2*solverBodyB.internalGetInvMass(),c.m_angularComponentB,deltaImpulse);
					c.m_appliedPushImpulse = m_xSplit[i];
				}
				
			}
		}
	}
	else
	{
	//	printf("m_fallback = %d\n",m_fallback);
		m_fallback++;
		btSequentialImpulseConstraintSolver::solveGroupCacheFriendlyIterations(bodies ,numBodies,manifoldPtr, numManifolds,constraints,numConstraints,infoGlobal,debugDrawer);
	}

	return 0.f;
}